

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

LY_ERR lyxml_ctx_new(ly_ctx *ctx,ly_in *in,lyxml_ctx **xmlctx_p)

{
  LY_ERR LVar1;
  undefined8 in_RAX;
  lyxml_ctx *xmlctx;
  ly_bool closing;
  ly_bool local_31;
  
  local_31 = (ly_bool)((ulong)in_RAX >> 0x38);
  xmlctx = (lyxml_ctx *)calloc(1,0x68);
  if (xmlctx == (lyxml_ctx *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_ctx_new");
    return LY_EMEM;
  }
  xmlctx->ctx = ctx;
  xmlctx->in = in;
  ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,in);
  LVar1 = lyxml_next_element(xmlctx,&(xmlctx->field_3).prefix,&(xmlctx->field_4).prefix_len,
                             &(xmlctx->field_5).name,&(xmlctx->field_6).name_len,&local_31);
  if (LVar1 != LY_SUCCESS) goto LAB_001a505b;
  if (*xmlctx->in->current == '\0') {
    xmlctx->status = LYXML_END;
  }
  else {
    if (local_31 != '\0') {
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Stray closing element tag (\"%.*s\").",
              (ulong)*(uint *)&xmlctx->field_6);
      LVar1 = LY_EVALID;
      goto LAB_001a505b;
    }
    LVar1 = lyxml_open_element(xmlctx,(xmlctx->field_3).prefix,(xmlctx->field_4).prefix_len,
                               (xmlctx->field_5).name,(xmlctx->field_6).name_len);
    if (LVar1 != LY_SUCCESS) goto LAB_001a505b;
    xmlctx->status = LYXML_ELEMENT;
  }
  LVar1 = LY_SUCCESS;
LAB_001a505b:
  if (LVar1 == LY_SUCCESS) {
    *xmlctx_p = xmlctx;
  }
  else {
    lyxml_ctx_free(xmlctx);
  }
  return LVar1;
}

Assistant:

LY_ERR
lyxml_ctx_new(const struct ly_ctx *ctx, struct ly_in *in, struct lyxml_ctx **xmlctx_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxml_ctx *xmlctx;
    ly_bool closing;

    /* new context */
    xmlctx = calloc(1, sizeof *xmlctx);
    LY_CHECK_ERR_RET(!xmlctx, LOGMEM(ctx), LY_EMEM);
    xmlctx->ctx = ctx;
    xmlctx->in = in;

    ly_log_location(NULL, NULL, NULL, in);

    /* parse next element, if any */
    LY_CHECK_GOTO(ret = lyxml_next_element(xmlctx, &xmlctx->prefix, &xmlctx->prefix_len, &xmlctx->name,
            &xmlctx->name_len, &closing), cleanup);

    if (xmlctx->in->current[0] == '\0') {
        /* update status */
        xmlctx->status = LYXML_END;
    } else if (closing) {
        LOGVAL(ctx, LYVE_SYNTAX, "Stray closing element tag (\"%.*s\").", (int)xmlctx->name_len, xmlctx->name);
        ret = LY_EVALID;
        goto cleanup;
    } else {
        /* open an element, also parses all enclosed namespaces */
        LY_CHECK_GOTO(ret = lyxml_open_element(xmlctx, xmlctx->prefix, xmlctx->prefix_len, xmlctx->name, xmlctx->name_len), cleanup);

        /* update status */
        xmlctx->status = LYXML_ELEMENT;
    }

cleanup:
    if (ret) {
        lyxml_ctx_free(xmlctx);
    } else {
        *xmlctx_p = xmlctx;
    }
    return ret;
}